

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int cuddCollectNodes(DdNode *f,st__table *visited)

{
  int iVar1;
  
  while( true ) {
    iVar1 = st__lookup(visited,(char *)f,(char **)0x0);
    if (iVar1 == 1) {
      return 1;
    }
    if (f == (DdNode *)0x0) {
      return 0;
    }
    iVar1 = st__add_direct(visited,(char *)f,(char *)0x0);
    if (iVar1 == -10000) {
      return 0;
    }
    if (f->index == 0x7fffffff) break;
    iVar1 = cuddCollectNodes((f->type).kids.T,visited);
    if (iVar1 != 1) {
      return iVar1;
    }
    f = (DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe);
  }
  return 1;
}

Assistant:

int
cuddCollectNodes(
  DdNode * f,
  st__table * visited)
{
    DdNode      *T, *E;
    int         retval;

#ifdef DD_DEBUG
    assert(!Cudd_IsComplement(f));
#endif

    /* If already visited, nothing to do. */
    if ( st__is_member(visited, (char *) f) == 1)
        return(1);

    /* Check for abnormal condition that should never happen. */
    if (f == NULL)
        return(0);

    /* Mark node as visited. */
    if ( st__add_direct(visited, (char *) f, NULL) == st__OUT_OF_MEM)
        return(0);

    /* Check terminal case. */
    if (cuddIsConstant(f))
        return(1);

    /* Recursive calls. */
    T = cuddT(f);
    retval = cuddCollectNodes(T,visited);
    if (retval != 1) return(retval);
    E = Cudd_Regular(cuddE(f));
    retval = cuddCollectNodes(E,visited);
    return(retval);

}